

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O1

void __thiscall
duckdb::NestedLoopJoinGlobalScanState::NestedLoopJoinGlobalScanState
          (NestedLoopJoinGlobalScanState *this,PhysicalNestedLoopJoin *op)

{
  pointer pGVar1;
  __pthread_list_t *this_00;
  
  (this->super_GlobalSourceState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSourceState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSourceState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSourceState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSourceState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSourceState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSourceState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSourceState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSourceState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_GlobalSourceState)._vptr_GlobalSourceState =
       (_func_int **)&PTR__NestedLoopJoinGlobalScanState_024a60f0;
  this->op = op;
  (this->scan_state).lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->scan_state).lock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->scan_state).lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->scan_state).lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->scan_state).lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->scan_state).data = (ColumnDataCollection *)0x0;
  (this->scan_state).global_scan.scan_state.current_chunk_state.handles._M_h._M_buckets =
       &(this->scan_state).global_scan.scan_state.current_chunk_state.handles._M_h._M_single_bucket;
  (this->scan_state).global_scan.scan_state.current_chunk_state.handles._M_h._M_bucket_count = 1;
  (this->scan_state).global_scan.scan_state.current_chunk_state.handles._M_h._M_before_begin._M_nxt
       = (_Hash_node_base *)0x0;
  (this->scan_state).global_scan.scan_state.current_chunk_state.handles._M_h._M_element_count = 0;
  (this->scan_state).global_scan.scan_state.current_chunk_state.handles._M_h._M_rehash_policy.
  _M_max_load_factor = 1.0;
  *(size_t *)
   ((long)&(this->scan_state).global_scan.scan_state.current_chunk_state.handles._M_h.
           _M_rehash_policy + 8) = 0;
  (this->scan_state).global_scan.scan_state.current_chunk_state.handles._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (this->scan_state).global_scan.scan_state.current_chunk_state.properties = INVALID;
  (this->scan_state).global_scan.lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->scan_state).global_scan.lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->scan_state).global_scan.lock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->scan_state).global_scan.lock.super___mutex_base._M_mutex + 0x10) = 0
  ;
  *(pointer *)
   ((long)&(this->scan_state).global_scan.scan_state.column_ids.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 0x10) =
       (pointer)0x0;
  (this->scan_state).global_scan.lock.super___mutex_base._M_mutex.__align = 0;
  (this->scan_state).global_scan.scan_state.column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scan_state).global_scan.scan_state.column_ids.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
       (pointer)0x0;
  pGVar1 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(op->super_PhysicalComparisonJoin).super_PhysicalJoin.
                       super_CachingPhysicalOperator.super_PhysicalOperator.sink_state);
  this_00 = &pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list;
  (this->scan_state).data = (ColumnDataCollection *)this_00;
  ColumnDataCollection::InitializeScan
            ((ColumnDataCollection *)this_00,&(this->scan_state).global_scan,ALLOW_ZERO_COPY);
  return;
}

Assistant:

explicit NestedLoopJoinGlobalScanState(const PhysicalNestedLoopJoin &op) : op(op) {
		D_ASSERT(op.sink_state);
		auto &sink = op.sink_state->Cast<NestedLoopJoinGlobalState>();
		sink.right_outer.InitializeScan(sink.right_payload_data, scan_state);
	}